

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

int __thiscall common_log::pause(common_log *this)

{
  pointer pcVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->running != false) {
    this->running = false;
    pcVar1 = (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar2 = this->tail;
    pcVar1[sVar2].is_end = true;
    this->tail = (sVar2 + 1) %
                 (ulong)(((long)(this->entries).
                                super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                        -0x5555555555555555);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    iVar3 = std::thread::join();
    return iVar3;
  }
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar3;
}

Assistant:

void pause() {
        {
            std::lock_guard<std::mutex> lock(mtx);

            if (!running) {
                return;
            }

            running = false;

            // push an entry to signal the worker thread to stop
            {
                auto & entry = entries[tail];
                entry.is_end = true;

                tail = (tail + 1) % entries.size();
            }

            cv.notify_one();
        }

        thrd.join();
    }